

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_VerifyFinal
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pSignature,CK_ULONG ulSignatureLen)

{
  bool bVar1;
  int iVar2;
  Session *this_00;
  MacAlgorithm *pMVar3;
  CK_RV CVar4;
  long in_RDX;
  long in_RDI;
  Session *session;
  CK_BYTE_PTR in_stack_00000030;
  Session *in_stack_00000038;
  CK_RV local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = 400;
  }
  else if (in_RDX == 0) {
    local_8 = 7;
  }
  else {
    this_00 = (Session *)HandleManager::getSession((HandleManager *)pSignature,ulSignatureLen);
    if (this_00 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      iVar2 = Session::getOpType(this_00);
      if ((iVar2 == 6) && (bVar1 = Session::getAllowMultiPartOp(this_00), bVar1)) {
        pMVar3 = Session::getMacOp(this_00);
        if (pMVar3 != (MacAlgorithm *)0x0) {
          CVar4 = MacVerifyFinal((Session *)this,(CK_BYTE_PTR)hSession,(CK_ULONG)pSignature);
          return CVar4;
        }
        CVar4 = AsymVerifyFinal(in_stack_00000038,in_stack_00000030,(CK_ULONG)this);
        return CVar4;
      }
      local_8 = 0x91;
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_VerifyFinal(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pSignature, CK_ULONG ulSignatureLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pSignature == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_VERIFY || !session->getAllowMultiPartOp())
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getMacOp() != NULL)
		return MacVerifyFinal(session, pSignature, ulSignatureLen);
	else
		return AsymVerifyFinal(session, pSignature, ulSignatureLen);
}